

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testYca.cpp
# Opt level: O3

void anon_unknown.dwarf_35d798::writeReadYca
               (char *fileName,Box2i *dw,RgbaChannels channels,LineOrder writeOrder,
               LineOrder readOrder,_func_void_Array2D<Imf_3_4::Rgba>_ptr_int_int *fillPixels)

{
  ulong uVar1;
  ulong uVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  ushort uVar6;
  bool bVar7;
  int iVar8;
  void *pvVar9;
  ostream *poVar10;
  long *plVar11;
  undefined8 uVar12;
  undefined4 in_register_0000000c;
  long lVar13;
  long lVar14;
  half *phVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  Array2D<Imf_3_4::Rgba> pixels1;
  int local_98;
  int local_80;
  undefined8 local_78;
  RgbaOutputFile out;
  
  lVar13 = (long)(dw->max).x - (long)(dw->min).x;
  uVar1 = lVar13 + 1;
  lVar14 = (long)(dw->max).y - (long)(dw->min).y;
  uVar2 = lVar14 + 1;
  uVar21 = -(ulong)(uVar2 * uVar1 >> 0x3d != 0) | uVar2 * uVar1 * 8;
  pixels1._sizeX = uVar2;
  pixels1._sizeY = uVar1;
  pixels1._data = (Rgba *)operator_new__(uVar21);
  pvVar9 = operator_new__(uVar21);
  poVar10 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," by ",4);
  iVar17 = (int)uVar2;
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," pixels, channels ",0x12);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,channels);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", write order ",0xe);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,writeOrder);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", read order ",0xd);
  plVar11 = (long *)std::ostream::operator<<(poVar10,readOrder);
  std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
  std::ostream::put((char)plVar11);
  std::ostream::flush();
  (*fillPixels)(&pixels1,(int)uVar1,iVar17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  local_78 = 0;
  uVar12 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,dw,dw,channels,&local_78,
             CONCAT44(in_register_0000000c,writeOrder),4,uVar12);
  Imf_3_4::RgbaOutputFile::setYCRounding((uint)&out,9);
  Imf_3_4::RgbaOutputFile::setFrameBuffer
            ((Rgba *)&out,
             (ulong)(pixels1._data + (-(long)(dw->min).y * pixels1._sizeY - (long)(dw->min).x)),1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&out);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  iVar8 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,fileName,iVar8);
  Imf_3_4::RgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(long)pvVar9 + (long)(dw->min).x * -8 + -(long)(dw->min).y * uVar1 * 8,1);
  local_98 = (int)lVar14;
  if (readOrder == INCREASING_Y) {
    iVar8 = (dw->min).y;
    if (iVar8 <= (dw->max).y) {
      do {
        Imf_3_4::RgbaInputFile::readPixels((int)&out);
        bVar7 = iVar8 < (dw->max).y;
        iVar8 = iVar8 + 1;
      } while (bVar7);
    }
  }
  else if (readOrder == DECREASING_Y) {
    iVar8 = (dw->max).y;
    if ((dw->min).y <= iVar8) {
      do {
        Imf_3_4::RgbaInputFile::readPixels((int)&out);
        bVar7 = (dw->min).y < iVar8;
        iVar8 = iVar8 + -1;
      } while (bVar7);
    }
  }
  else if (readOrder == RANDOM_Y) {
    if (iVar17 * -0x33333333 + 0x19999999U < 0x33333333) {
      __assert_fail("h % 5 != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                    ,0x88,
                    "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                   );
    }
    if (-1 < local_98) {
      uVar21 = uVar2 & 0xffffffff;
      do {
        Imf_3_4::RgbaInputFile::readPixels((int)&out);
        uVar20 = (int)uVar21 - 1;
        uVar21 = (ulong)uVar20;
      } while (uVar20 != 0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"invalid line order ",0x13);
    plVar11 = (long *)std::ostream::operator<<(&std::cerr,readOrder);
    std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
    std::ostream::put((char)plVar11);
    std::ostream::flush();
  }
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  if (-1 < local_98) {
    lVar14 = (long)pvVar9 + 6;
    phVar15 = &(pixels1._data)->a;
    uVar21 = 0;
    do {
      local_80 = (int)lVar13;
      if (-1 < local_80) {
        uVar18 = 0;
        do {
          if ((channels & WRITE_C) == 0) {
            fVar4 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar18 * 4 + -2]._h * 4);
            pfVar3 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar14 + -4 + uVar18 * 8) * 4);
            if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
              __assert_fail("p1.g == p2.g",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                            ,0xaa,
                            "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                           );
            }
            fVar4 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar18 * 4 + -1]._h * 4);
            pfVar3 = (float *)(_imath_half_to_float_table +
                              (ulong)*(ushort *)(lVar14 + -2 + uVar18 * 8) * 4);
            if ((fVar4 != *pfVar3) || (NAN(fVar4) || NAN(*pfVar3))) {
              __assert_fail("p1.b == p2.b",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                            ,0xab,
                            "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                           );
            }
          }
          else {
            uVar19 = (ulong)phVar15[uVar18 * 4 + -2]._h;
            fVar4 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar18 * 4 + -1]._h * 4);
            pfVar3 = (float *)(_imath_half_to_float_table + uVar19 * 4);
            if (*pfVar3 <= fVar4 && fVar4 != *pfVar3) {
              uVar19 = (ulong)phVar15[uVar18 * 4 + -1]._h;
            }
            fVar4 = *(float *)(_imath_half_to_float_table + uVar19 * 4);
            pfVar3 = (float *)(_imath_half_to_float_table + (ulong)phVar15[uVar18 * 4 + -3]._h * 4);
            if (fVar4 < *pfVar3 || fVar4 == *pfVar3) {
              uVar19 = (ulong)phVar15[uVar18 * 4 + -3]._h;
            }
            uVar16 = (ulong)*(ushort *)(lVar14 + -4 + uVar18 * 8);
            uVar22 = (ulong)*(ushort *)(lVar14 + -2 + uVar18 * 8);
            fVar4 = *(float *)(_imath_half_to_float_table + uVar22 * 4);
            pfVar3 = (float *)(_imath_half_to_float_table + uVar16 * 4);
            if (*pfVar3 <= fVar4 && fVar4 != *pfVar3) {
              uVar16 = uVar22;
            }
            uVar6 = *(ushort *)(lVar14 + -6 + uVar18 * 8);
            fVar4 = *(float *)(_imath_half_to_float_table + uVar16 * 4);
            pfVar3 = (float *)(_imath_half_to_float_table + (ulong)uVar6 * 4);
            if (fVar4 < *pfVar3 || fVar4 == *pfVar3) {
              uVar16 = (ulong)uVar6;
            }
            fVar4 = *(float *)(_imath_half_to_float_table + uVar19 * 4);
            fVar5 = *(float *)(_imath_half_to_float_table + uVar16 * 4);
            if (0.03 < (float)(~-(uint)(fVar5 < fVar4) & (uint)(fVar5 - fVar4) |
                              (uint)(fVar4 - fVar5) & -(uint)(fVar5 < fVar4))) {
              __assert_fail("equalWithAbsError (p1Max, p2Max, 0.03f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                            ,0xa6,
                            "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                           );
            }
          }
          if (((channels & WRITE_A) != 0) &&
             ((fVar4 = *(float *)(_imath_half_to_float_table + (ulong)phVar15[uVar18 * 4]._h * 4),
              pfVar3 = (float *)(_imath_half_to_float_table +
                                (ulong)*(ushort *)(lVar14 + uVar18 * 8) * 4), fVar4 != *pfVar3 ||
              (NAN(fVar4) || NAN(*pfVar3))))) {
            __assert_fail("p1.a == p2.a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testYca.cpp"
                          ,0xae,
                          "void (anonymous namespace)::writeReadYca(const char *, const Box2i &, RgbaChannels, LineOrder, LineOrder, void (*)(Array2D<Rgba> &, int, int))"
                         );
          }
          uVar18 = uVar18 + 1;
        } while ((uVar1 & 0xffffffff) != uVar18);
      }
      uVar21 = uVar21 + 1;
      lVar14 = lVar14 + uVar1 * 8;
      phVar15 = phVar15 + pixels1._sizeY * 4;
    } while (uVar21 != (uVar2 & 0xffffffff));
  }
  remove(fileName);
  operator_delete__(pvVar9);
  if (pixels1._data != (Rgba *)0x0) {
    operator_delete__(pixels1._data);
  }
  return;
}

Assistant:

void
writeReadYca (
    const char   fileName[],
    const Box2i& dw,
    RgbaChannels channels,
    LineOrder    writeOrder,
    LineOrder    readOrder,
    void (*fillPixels) (Array2D<Rgba>& pixels, int w, int h))
{
    int           w = dw.max.x - dw.min.x + 1;
    int           h = dw.max.y - dw.min.y + 1;
    Array2D<Rgba> pixels1 (h, w);
    Array2D<Rgba> pixels2 (h, w);

    cout << w << " by " << h
         << " pixels, "
            "channels "
         << channels
         << ", "
            "write order "
         << writeOrder
         << ", "
            "read order "
         << readOrder << endl;

    fillPixels (pixels1, w, h);

    cout << "writing " << flush;

    {
        RgbaOutputFile out (
            fileName,
            dw,
            dw, // display window, data window
            channels,
            1,          // pixelAspectRatio
            V2f (0, 0), // screenWindowCenter
            1,          // screenWindowWidth
            writeOrder);

        out.setYCRounding (9, 9);
        out.setFrameBuffer (&pixels1[-dw.min.y][-dw.min.x], 1, w);
        out.writePixels (h);
    }

    cout << "reading " << flush;

    {
        RgbaInputFile in (fileName);

        in.setFrameBuffer (&pixels2[-dw.min.y][-dw.min.x], 1, w);

        switch (readOrder)
        {
            case INCREASING_Y:

                for (int y = dw.min.y; y <= dw.max.y; ++y)
                    in.readPixels (y);

                break;

            case DECREASING_Y:

                for (int y = dw.max.y; y >= dw.min.y; --y)
                    in.readPixels (y);

                break;

            case RANDOM_Y:

                assert (h % 5 != 0);

                for (int i = 0; i < h; ++i)
                {
                    int y = dw.min.y + (i * 5) % h;
                    in.readPixels (y);
                }

                break;
            case NUM_LINEORDERS:
            default:
                cerr << "invalid line order " << int (readOrder) << std::endl;
                break;
        }
    }

    cout << "comparing" << endl;

    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            const Rgba& p1 = pixels1[y][x];
            const Rgba& p2 = pixels2[y][x];

            if (channels & WRITE_C)
            {
                float p1Max = max (p1.r, max (p1.g, p1.b));
                float p2Max = max (p2.r, max (p2.g, p2.b));

                assert (equalWithAbsError (p1Max, p2Max, 0.03f));
            }
            else
            {
                assert (p1.g == p2.g);
                assert (p1.b == p2.b);
            }

            if (channels & WRITE_A) { assert (p1.a == p2.a); }
        }
    }

    remove (fileName);
}